

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

char * Gia_ManToMiniLutAttr(Gia_Man_t *pGia,void *pMiniLut)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar9 = 1;
  pcVar6 = (char *)calloc((long)*(int *)((long)pMiniLut + 4),1);
  iVar1 = pGia->nObjs;
  if (1 < (long)iVar1) {
    pVVar4 = pGia->vMapping;
    uVar2 = pVVar4->nSize;
    uVar7 = 1;
    if (1 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    lVar8 = 0x14;
    do {
      if (uVar7 == uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = pVVar4->pArray;
      uVar3 = piVar5[uVar9];
      if ((ulong)uVar3 != 0) {
        if (((int)uVar3 < 0) || (uVar2 <= uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar5 = piVar5 + uVar3;
        if (piVar5[(long)*piVar5 + 1] < 0) {
          pcVar6[*(uint *)(&pGia->pObjs->field_0x0 + lVar8)] = '\x01';
        }
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0xc;
    } while ((long)iVar1 != uVar9);
  }
  return pcVar6;
}

Assistant:

char * Gia_ManToMiniLutAttr( Gia_Man_t * pGia, void * pMiniLut )
{ 
    Mini_Lut_t * p = (Mini_Lut_t *)pMiniLut; int i;
    char * pAttrs = ABC_CALLOC( char, Mini_LutNodeNum(p) );
    Gia_ManForEachLut( pGia, i )
        if ( Gia_ObjLutIsMux(pGia, i) )
            pAttrs[Gia_ManObj(pGia, i)->Value] = 1;
    return pAttrs;
}